

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O1

void init_and_get_number_of_frames(filename_list_node *fln,int *do_scan)

{
  input_ops *piVar1;
  int iVar2;
  undefined8 *puVar3;
  size_t sVar4;
  input_handle *ih;
  input_ops *ops;
  input_handle *local_40;
  input_ops *local_38;
  
  local_38 = (input_ops *)0x0;
  local_40 = (input_handle *)0x0;
  puVar3 = (undefined8 *)g_malloc(0x58);
  fln->d = puVar3;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  iVar2 = open_plugin(fln->fr->raw,fln->fr->display,&local_38,&local_40);
  piVar1 = local_38;
  if (iVar2 == 0) {
    *do_scan = 1;
    sVar4 = (*local_38->get_total_frames)(local_40);
    puVar3[1] = sVar4;
    g_mutex_lock(&progress_mutex);
    total_frames = total_frames + puVar3[1];
    g_cond_broadcast(&progress_cond);
    g_mutex_unlock(&progress_mutex);
    (*piVar1->close_file)(local_40);
  }
  if (local_40 != (input_handle *)0x0) {
    (*local_38->handle_destroy)(&local_40);
  }
  return;
}

Assistant:

void
init_and_get_number_of_frames(struct filename_list_node *fln, int *do_scan)
{
	struct file_data *fd;

	struct input_ops *ops = NULL;
	struct input_handle *ih = NULL;
	int result;

	fln->d = g_malloc(sizeof(struct file_data));
	memcpy(fln->d, &empty, sizeof empty);
	fd = (struct file_data *)fln->d;

	result = open_plugin(fln->fr->raw, fln->fr->display, &ops, &ih);
	if (result) {
		goto free;
	}

	*do_scan = TRUE;
	fd->number_of_frames = ops->get_total_frames(ih);
	g_mutex_lock(&progress_mutex);
	total_frames += fd->number_of_frames;
	g_cond_broadcast(&progress_cond);
	g_mutex_unlock(&progress_mutex);

free:
	if (!result) {
		ops->close_file(ih);
	}
	if (ih) {
		ops->handle_destroy(&ih);
	}
}